

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

int enhance_weapon_skill(void)

{
  ushort uVar1;
  char cVar2;
  boolean bVar3;
  boolean bVar4;
  uint uVar5;
  nh_menuitem *pnVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  int local_1cc;
  char *local_198;
  bool local_189;
  char *local_188;
  boolean skill_advanced;
  nh_menuitem *_item__3;
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  undefined1 auStack_140 [7];
  boolean speedy;
  menulist menu;
  char *prefix;
  char buf [256];
  int selected [1];
  int eventually_advance;
  int to_advance;
  int id;
  int crosstrain;
  int n;
  int i;
  int pass;
  
  _item_._7_1_ = '\0';
  if ((flags.debug != '\0') &&
     (cVar2 = yn_function("Advance skills without practice?","yn",'n'), cVar2 == 'y')) {
    _item_._7_1_ = '\x01';
  }
  init_menulist((menulist *)auStack_140);
  do {
    menu.items._4_4_ = 0;
    buf[0xfc] = '\0';
    buf[0xfd] = '\0';
    buf[0xfe] = '\0';
    buf[0xff] = '\0';
    selected[0] = 0;
    for (crosstrain = 0; crosstrain < 0x2a; crosstrain = crosstrain + 1) {
      if (u.weapon_skills[crosstrain].skill != '\0') {
        bVar3 = can_advance(crosstrain,_item_._7_1_);
        if (bVar3 == '\0') {
          bVar3 = could_advance(crosstrain);
          if (bVar3 != '\0') {
            buf._252_4_ = buf._252_4_ + 1;
          }
        }
        else {
          selected[0] = selected[0] + 1;
        }
      }
    }
    if (0 < (int)buf._252_4_) {
      pcVar9 = "s";
      if (buf._252_4_ == 1) {
        pcVar9 = "";
      }
      pcVar8 = "if skill slots become available";
      if (u.ulevel < 0x1e) {
        pcVar8 = "when you\'re more experienced";
      }
      sprintf((char *)&prefix,"(Skill%s flagged by \"*\" may be enhanced %s.)",pcVar9,pcVar8);
      if ((int)menu.items <= menu.items._4_4_) {
        menu.items._0_4_ = (int)menu.items << 1;
        _auStack_140 = (nh_menuitem *)realloc(_auStack_140,(long)(int)menu.items * 0x10c);
      }
      pnVar6 = _auStack_140 + menu.items._4_4_;
      pnVar6->id = 0;
      pnVar6->role = MI_TEXT;
      pnVar6->accel = '\0';
      pnVar6->group_accel = '\0';
      pnVar6->selected = '\0';
      strcpy(pnVar6->caption,(char *)&prefix);
      menu.items._4_4_ = menu.items._4_4_ + 1;
      if ((int)menu.items <= menu.items._4_4_) {
        menu.items._0_4_ = (int)menu.items << 1;
        _auStack_140 = (nh_menuitem *)realloc(_auStack_140,(long)(int)menu.items * 0x10c);
      }
      pnVar6 = _auStack_140 + menu.items._4_4_;
      pnVar6->id = 0;
      pnVar6->role = MI_TEXT;
      pnVar6->accel = '\0';
      pnVar6->group_accel = '\0';
      pnVar6->selected = '\0';
      strcpy(pnVar6->caption,"");
      menu.items._4_4_ = menu.items._4_4_ + 1;
    }
    for (n = 0; n < 3; n = n + 1) {
      for (crosstrain = (int)skill_ranges[n].first; crosstrain <= skill_ranges[n].last;
          crosstrain = crosstrain + 1) {
        if (crosstrain == skill_ranges[n].first) {
          if ((int)menu.items <= menu.items._4_4_) {
            menu.items._0_4_ = (int)menu.items << 1;
            _auStack_140 = (nh_menuitem *)realloc(_auStack_140,(long)(int)menu.items * 0x10c);
          }
          pnVar6 = _auStack_140 + menu.items._4_4_;
          pnVar6->id = 0;
          pnVar6->role = MI_HEADING;
          pnVar6->accel = '\0';
          pnVar6->group_accel = '\0';
          pnVar6->selected = '\0';
          strcpy(pnVar6->caption,skill_ranges[n].name);
          menu.items._4_4_ = menu.items._4_4_ + 1;
        }
        if (u.weapon_skills[crosstrain].skill != '\0') {
          bVar3 = can_advance(crosstrain,_item_._7_1_);
          if (bVar3 == '\0') {
            bVar3 = could_advance(crosstrain);
            if (bVar3 == '\0') {
              menu._8_8_ = "";
              if (0 < selected[0] + buf._252_4_) {
                menu._8_8_ = "    ";
              }
            }
            else {
              menu._8_8_ = anon_var_dwarf_c6a9d;
            }
          }
          else {
            menu._8_8_ = (long)"\n\n" + 2;
          }
          strcpy((char *)&prefix," ");
          pcVar9 = eos((char *)&prefix);
          if (skill_names_indices[crosstrain] < 1) {
            if (crosstrain == 0x25) {
              local_189 = urole.malenum == 0x165 || urole.malenum == 0x160;
              local_198 = barehands_or_martial[(int)(uint)local_189];
            }
            else {
              local_198 = odd_skill_names[-(int)skill_names_indices[crosstrain]];
            }
            local_188 = local_198;
          }
          else {
            local_188 = obj_descr[objects[skill_names_indices[crosstrain]].oc_name_idx].oc_name;
          }
          sprintf(pcVar9,"%s%s",menu._8_8_,local_188);
          uVar5 = skill_crosstrain_bonus(crosstrain);
          if ((1 < (int)uVar5) &&
             (u.weapon_skills[crosstrain].skill < u.weapon_skills[crosstrain].max_skill)) {
            pcVar9 = eos((char *)&prefix);
            sprintf(pcVar9," (x%d)",(ulong)uVar5);
          }
          pcVar9 = eos((char *)&prefix);
          pcVar8 = skill_level_name(u.weapon_skills[crosstrain].skill);
          pcVar7 = skill_level_name(u.weapon_skills[crosstrain].max_skill);
          sprintf(pcVar9,"\t[%s\t/ %s]",pcVar8,pcVar7);
          if (u.weapon_skills[crosstrain].skill == u.weapon_skills[crosstrain].max_skill) {
            pcVar9 = eos((char *)&prefix);
            sprintf(pcVar9,"\t   MAX");
          }
          else if (u.weapon_skills[crosstrain].advance == 0) {
            pcVar9 = eos((char *)&prefix);
            sprintf(pcVar9,"\t      ");
          }
          else {
            pcVar9 = eos((char *)&prefix);
            uVar5 = skill_training_percent(crosstrain);
            sprintf(pcVar9,"\t%5d%%",(ulong)uVar5);
          }
          if (flags.debug != '\0') {
            pcVar9 = eos((char *)&prefix);
            uVar1 = u.weapon_skills[crosstrain].advance;
            uVar5 = practice_needed_to_advance(crosstrain,(int)u.weapon_skills[crosstrain].skill);
            sprintf(pcVar9,"/%5d(%4d)",(ulong)uVar1,(ulong)uVar5);
          }
          bVar3 = could_advance(crosstrain);
          if (((bVar3 != '\0') || (bVar3 = can_advance(crosstrain,_item_._7_1_), bVar3 != '\0')) &&
             ((flags.debug == '\0' || (_item_._7_1_ == '\0')))) {
            pcVar9 = eos((char *)&prefix);
            uVar5 = slots_required(crosstrain);
            sprintf(pcVar9," (%d to advance)",(ulong)uVar5);
          }
          bVar3 = can_advance(crosstrain,_item_._7_1_);
          if (bVar3 == '\0') {
            local_1cc = 0;
          }
          else {
            local_1cc = crosstrain + 1;
          }
          if ((int)menu.items <= menu.items._4_4_) {
            menu.items._0_4_ = (int)menu.items << 1;
            _auStack_140 = (nh_menuitem *)realloc(_auStack_140,(long)(int)menu.items * 0x10c);
          }
          pnVar6 = _auStack_140 + menu.items._4_4_;
          pnVar6->id = local_1cc;
          pnVar6->role = MI_NORMAL;
          pnVar6->accel = '\0';
          pnVar6->group_accel = '\0';
          pnVar6->selected = '\0';
          strcpy(pnVar6->caption,(char *)&prefix);
          menu.items._4_4_ = menu.items._4_4_ + 1;
        }
      }
    }
    pcVar9 = "Current skills:";
    if (0 < selected[0]) {
      pcVar9 = "Pick a skill to advance:";
    }
    strcpy((char *)&prefix,pcVar9);
    if ((flags.debug == '\0') || (_item_._7_1_ == '\0')) {
      pcVar9 = eos((char *)&prefix);
      sprintf(pcVar9,"  (%d slot%s available)",(ulong)(uint)u.weapon_slots);
    }
    id = display_menu(_auStack_140,menu.items._4_4_,(char *)&prefix,(uint)(selected[0] != 0),
                      (int *)(buf + 0xf8));
    if (id == 1) {
      bVar3 = skill_advance(buf._248_4_ + -1);
      id = 0;
      for (crosstrain = 0; crosstrain < 0x2a; crosstrain = crosstrain + 1) {
        bVar4 = can_advance(crosstrain,_item_._7_1_);
        if (bVar4 != '\0') {
          if ((bVar3 != '\0') && (_item_._7_1_ == '\0')) {
            pline("You feel you could be more dangerous!");
          }
          id = 1;
          break;
        }
      }
    }
    if (_item_._7_1_ == '\0' || id < 1) {
      free(_auStack_140);
      return 0;
    }
  } while( true );
}

Assistant:

int enhance_weapon_skill(void)
{
    int pass, i, n, crosstrain, id,
	to_advance, eventually_advance, selected[1];
    char buf[BUFSZ];
    const char *prefix;
    struct menulist menu;
    boolean speedy = FALSE;

    if (wizard && yn("Advance skills without practice?") == 'y')
	speedy = TRUE;

    init_menulist(&menu);
    do {
	menu.icount = 0;
	/* count skills that can advance */
	to_advance = eventually_advance = 0;
	for (i = 0; i < P_NUM_SKILLS; i++) {
	    if (P_RESTRICTED(i))
		continue;
	    if (can_advance(i, speedy)) to_advance++;
	    else if (could_advance(i)) eventually_advance++;
	}

	/* start with a legend if any entries will be annotated
	    with "*" below */
	if (eventually_advance > 0) {
	    sprintf(buf,
		    "(Skill%s flagged by \"*\" may be enhanced %s.)",
		    plur(eventually_advance),
		    (u.ulevel < MAXULEV) ?
			"when you're more experienced" :
			"if skill slots become available");
	    add_menutext(&menu, buf);
	    add_menutext(&menu, "");
	}

	/* List the skills, making ones that could be advanced
	    selectable.  List the miscellaneous skills first.
	    Possible future enhancement:  list spell skills before
	    weapon skills for spellcaster roles. */
	for (pass = 0; pass < SIZE(skill_ranges); pass++)
	    for (i = skill_ranges[pass].first;
		i <= skill_ranges[pass].last; i++) {
	    /* Print headings for skill types */
	    if (i == skill_ranges[pass].first)
		add_menuheading(&menu, skill_ranges[pass].name);

	    if (P_RESTRICTED(i))
		continue;
	    /*
	     * The 12 is the longest skill level name.
	     * The "    " is room for a selection letter and dash, "a - ".
	     */
	    if (can_advance(i, speedy))
		prefix = "";	/* will be preceded by menu choice */
	    else if (could_advance(i))
		prefix = "  * ";
	    else
		prefix = (to_advance + eventually_advance > 0) ? "    " : "";
	    strcpy(buf, " ");
	    sprintf(eos(buf), "%s%s", prefix, P_NAME(i));
	    crosstrain = skill_crosstrain_bonus(i);
	    if (crosstrain > 1 && P_SKILL(i) < P_MAX_SKILL(i))
		sprintf(eos(buf), " (x%d)", crosstrain);

	    sprintf(eos(buf), "\t[%s\t/ %s]",
		    skill_level_name(P_SKILL(i)),
		    skill_level_name(P_MAX_SKILL(i)));

	    if (P_SKILL(i) == P_MAX_SKILL(i)) {
		sprintf(eos(buf), "\t   MAX");
	    } else if (P_ADVANCE(i) == 0) {
		sprintf(eos(buf), "\t      ");
	    } else {
		sprintf(eos(buf), "\t%5d%%", skill_training_percent(i));
	    }
	    if (wizard) {
		sprintf(eos(buf), "/%5d(%4d)",
			P_ADVANCE(i), practice_needed_to_advance(i, P_SKILL(i)));
	    }

	    if ((could_advance(i) || can_advance(i, speedy)) && !(wizard && speedy))
		sprintf(eos(buf), " (%d to advance)", slots_required(i));
	    id = can_advance(i, speedy) ? i+1 : 0;
	    add_menuitem(&menu, id, buf, 0, FALSE);
	}

	strcpy(buf, (to_advance > 0) ? "Pick a skill to advance:" :
					"Current skills:");
	if (!(wizard && speedy)) {
	    sprintf(eos(buf), "  (%d slot%s available)",
		    u.weapon_slots, plur(u.weapon_slots));
	}
	n = display_menu(menu.items, menu.icount, buf,
			    to_advance ? PICK_ONE : PICK_NONE, selected);
	if (n == 1) {
	    boolean skill_advanced;
	    n = selected[0] - 1;	/* get item selected */
	    skill_advanced = skill_advance(n);
	    /* check for more skills able to advance, if so then .. */
	    for (n = i = 0; i < P_NUM_SKILLS; i++) {
		if (can_advance(i, speedy)) {
		    if (skill_advanced && !speedy)
			pline("You feel you could be more dangerous!");
		    n++;
		    break;
		}
	    }
	}
    } while (speedy && n > 0);
    
    free(menu.items);
    return 0;
}